

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  float *pFramesInF32;
  float *pFramesOutF32;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  ma_uint64 iFrame;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_channel_converter *pConverter_local;
  
  if (pConverter == (ma_channel_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85cc,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pFramesOut == (void *)0x0) {
    __assert_fail("pFramesOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85cd,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pFramesIn == (void *)0x0) {
    __assert_fail("pFramesIn != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85ce,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->channelsIn != 2) {
    __assert_fail("pConverter->channelsIn == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85cf,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->channelsOut != 1) {
    __assert_fail("pConverter->channelsOut == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x85d0,
                  "ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->format == ma_format_s16) {
    for (pFramesOutS16 = (ma_int16 *)0x0; pFramesOutS16 < frameCount;
        pFramesOutS16 = (ma_int16 *)((long)pFramesOutS16 + 1)) {
      *(short *)((long)pFramesOut + (long)pFramesOutS16 * 2) =
           (short)((long)((int)*(short *)((long)pFramesIn + (long)pFramesOutS16 * 4) +
                         (int)*(short *)((long)pFramesIn + (long)pFramesOutS16 * 4 + 2)) / 2);
    }
  }
  else {
    for (pFramesOutS16 = (ma_int16 *)0x0; pFramesOutS16 < frameCount;
        pFramesOutS16 = (ma_int16 *)((long)pFramesOutS16 + 1)) {
      *(float *)((long)pFramesOut + (long)pFramesOutS16 * 4) =
           (*(float *)((long)pFramesIn + (long)pFramesOutS16 * 8) +
           *(float *)((long)pFramesIn + (long)pFramesOutS16 * 8)) * 0.5;
    }
  }
  return 0;
}

Assistant:

static ma_result ma_channel_converter_process_pcm_frames__stereo_to_mono(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint64 iFrame;

    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pFramesOut != NULL);
    MA_ASSERT(pFramesIn  != NULL);
    MA_ASSERT(pConverter->channelsIn  == 2);
    MA_ASSERT(pConverter->channelsOut == 1);

    if (pConverter->format == ma_format_s16) {
        /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
        const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; ++iFrame) {
            pFramesOutS16[iFrame] = (ma_int16)(((ma_int32)pFramesInS16[iFrame*2+0] + (ma_int32)pFramesInS16[iFrame*2+1]) / 2);
        }
    } else {
        /* */ float* pFramesOutF32 = (      float*)pFramesOut;
        const float* pFramesInF32  = (const float*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; ++iFrame) {
            pFramesOutF32[iFrame] = (pFramesInF32[iFrame*2+0] + pFramesInF32[iFrame*2+0]) * 0.5f;
        }
    }

    return MA_SUCCESS;
}